

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O3

mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
* __thiscall
ising::tc::
square<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
          (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
           *__return_storage_ptr__,tc *this,
          mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
          *Jx,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
              *Jy)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *pmVar14;
  tc tVar15;
  bool bVar16;
  int iVar17;
  cpp_dec_float<100U,_int,_void> *pcVar18;
  long lVar19;
  runtime_error *this_00;
  code *pcVar20;
  long lVar21;
  undefined *puVar22;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  xn;
  autodiff_fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_1UL>
  vn;
  autodiff_fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_1UL>
  v;
  multiply_immediates local_7d9;
  uint local_7d8;
  uint uStack_7d4;
  uint uStack_7d0;
  uint uStack_7cc;
  uint local_7c8;
  uint uStack_7c4;
  uint uStack_7c0;
  uint uStack_7bc;
  uint local_7b8;
  uint uStack_7b4;
  uint uStack_7b0;
  uint uStack_7ac;
  uint local_7a8;
  uint uStack_7a4;
  undefined5 uStack_7a0;
  undefined3 uStack_79b;
  int iStack_798;
  char cStack_794;
  undefined8 local_790;
  long local_780;
  type local_778;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *pnStack_770;
  uint local_768 [2];
  uint auStack_760 [10];
  int local_738;
  char local_734 [4];
  fpclass_type local_730;
  int32_t iStack_72c;
  undefined1 local_728 [8];
  type pnStack_720;
  uint local_718 [11];
  undefined3 uStack_6eb;
  int iStack_6e8;
  bool bStack_6e4;
  undefined8 local_6e0;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *local_680;
  expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_678;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_668;
  undefined1 local_618 [16];
  uint local_608 [2];
  uint auStack_600 [2];
  uint local_5f8 [2];
  uint auStack_5f0 [2];
  uint local_5e8 [2];
  uint auStack_5e0 [2];
  int local_5d8;
  bool local_5d4;
  fpclass_type local_5d0;
  int32_t iStack_5cc;
  undefined1 local_5c8 [16];
  uint local_5b8 [2];
  uint auStack_5b0 [2];
  uint local_5a8 [2];
  uint auStack_5a0 [2];
  uint local_598 [2];
  uint auStack_590 [2];
  int local_588;
  bool local_584;
  fpclass_type local_580;
  int32_t iStack_57c;
  uint local_578 [2];
  uint auStack_570 [2];
  uint local_568 [2];
  uint auStack_560 [2];
  uint local_558 [2];
  uint uStack_550;
  uint uStack_54c;
  uint uStack_548;
  uint auStack_544 [3];
  expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_538;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  int local_4f8;
  undefined1 local_4f4;
  undefined8 local_4f0;
  undefined1 local_4e8 [12];
  uint uStack_4dc;
  uint uStack_4d8;
  uint local_4d4 [2];
  uint auStack_4cc [2];
  uint auStack_4c4 [5];
  uint auStack_4b0 [2];
  int local_4a8;
  bool local_4a4;
  fpclass_type local_4a0;
  int32_t iStack_49c;
  type local_498;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *pnStack_490;
  uint local_488 [2];
  uint auStack_480 [2];
  uint local_478 [2];
  uint auStack_470 [2];
  uint local_468 [2];
  uint auStack_460 [2];
  int local_458;
  bool local_454;
  fpclass_type local_450;
  int32_t local_44c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_448;
  cpp_dec_float<100U,_int,_void> local_3f8;
  cpp_dec_float<100U,_int,_void> local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_358;
  undefined1 local_308 [8];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *pnStack_300;
  uint local_2f8 [11];
  undefined3 uStack_2cb;
  int iStack_2c8;
  bool bStack_2c4;
  undefined8 local_2c0;
  uint local_268 [5];
  uint local_254 [2];
  uint auStack_24c [2];
  uint local_244 [5];
  uint auStack_230 [2];
  int local_228;
  char local_224;
  fpclass_type local_220;
  int32_t iStack_21c;
  undefined1 local_218 [16];
  uint local_208 [2];
  uint auStack_200 [2];
  uint local_1f8 [2];
  uint auStack_1f0 [2];
  uint local_1e8 [2];
  uint auStack_1e0 [2];
  int local_1d8;
  tc local_1d4;
  undefined8 local_1d0;
  uint local_1c8 [2];
  uint auStack_1c0 [2];
  uint local_1b8 [2];
  uint auStack_1b0 [2];
  uint local_1a8 [2];
  uint auStack_1a0 [2];
  uint local_198 [2];
  uint auStack_190 [2];
  int local_188;
  bool local_184;
  undefined8 local_180;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_178;
  undefined1 local_128 [16];
  uint local_118 [2];
  uint auStack_110 [2];
  uint local_108 [2];
  uint auStack_100 [2];
  uint local_f8 [2];
  uint auStack_f0 [2];
  int local_e8;
  bool local_e4;
  fpclass_type local_e0;
  int32_t iStack_dc;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_d8;
  type local_88;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *pnStack_80;
  uint local_78 [2];
  uint auStack_70 [2];
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [2];
  uint auStack_50 [2];
  int local_48;
  bool local_44;
  undefined8 local_40;
  long local_38;
  
  tVar15 = this[0x44];
  if (tVar15 == (tc)0x1) {
    tVar15 = (tc)(*(int *)this == 0 && *(int *)(this + 0x48) == 0);
  }
  this[0x44] = tVar15;
  bVar16 = (Jx->base).m_backend.neg;
  if (bVar16 == true) {
    bVar16 = (Jx->base).m_backend.data._M_elems[0] == 0 &&
             (Jx->base).m_backend.fpclass == cpp_dec_float_finite;
  }
  (Jx->base).m_backend.neg = bVar16;
  local_2c0._0_4_ = cpp_dec_float_finite;
  local_2c0._4_4_ = 0x10;
  local_308 = (undefined1  [8])0x0;
  pnStack_300 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                 *)0x0;
  local_2f8[0] = 0;
  local_2f8[1] = 0;
  local_2f8[2] = 0;
  local_2f8[3] = 0;
  local_2f8[4] = 0;
  local_2f8[5] = 0;
  local_2f8[6] = 0;
  local_2f8[7] = 0;
  local_2f8[8] = 0;
  local_2f8[9] = 0;
  stack0xfffffffffffffd30 = 0;
  uStack_2cb = 0;
  iStack_2c8 = 0;
  bStack_2c4 = false;
  local_680 = __return_storage_ptr__;
  local_218._0_8_ = this;
  local_218._8_8_ = Jx;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
  ::
  do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
            ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
              *)local_308,
             (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
              *)local_218,(multiply_immediates *)local_728);
  local_728 = local_308;
  pnStack_720 = pnStack_300;
  local_718[0] = local_2f8[0];
  local_718[1] = local_2f8[1];
  local_718[2] = local_2f8[2];
  local_718[3] = local_2f8[3];
  local_718[4] = local_2f8[4];
  local_718[5] = local_2f8[5];
  local_718[6] = local_2f8[6];
  local_718[7] = local_2f8[7];
  local_718[8] = local_2f8[8];
  local_718[9] = local_2f8[9];
  stack0xfffffffffffff910 = stack0xfffffffffffffd30;
  uStack_6eb = uStack_2cb;
  iStack_6e8 = iStack_2c8;
  bStack_6e4 = bStack_2c4;
  local_6e0._0_4_ = (fpclass_type)local_2c0;
  local_6e0._4_4_ = local_2c0._4_4_;
  local_308 = (undefined1  [8])((ulong)local_308 & 0xffffffff00000000);
  bVar16 = operator<=((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                       *)local_728,(int *)local_308);
  if (bVar16) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              ((invalid_argument *)this_00,"Jx * Jy should be non-zero");
    puVar22 = &std::invalid_argument::typeinfo;
    pcVar20 = std::invalid_argument::~invalid_argument;
  }
  else {
    local_218._0_8_ = *(undefined8 *)this;
    local_218._8_8_ = *(undefined8 *)(this + 8);
    local_208 = *(uint (*) [2])(this + 0x10);
    auStack_200 = *(uint (*) [2])(this + 0x18);
    local_1f8 = *(uint (*) [2])(this + 0x20);
    auStack_1f0 = *(uint (*) [2])(this + 0x28);
    local_1e8 = *(uint (*) [2])(this + 0x30);
    auStack_1e0 = *(uint (*) [2])(this + 0x38);
    local_1d8 = *(int *)(this + 0x40);
    local_1d4 = this[0x44];
    local_1d0 = *(undefined8 *)(this + 0x48);
    local_1c8 = *(uint (*) [2])(Jx->base).m_backend.data._M_elems;
    auStack_1c0 = *(uint (*) [2])((Jx->base).m_backend.data._M_elems + 2);
    local_1b8 = *(uint (*) [2])((Jx->base).m_backend.data._M_elems + 4);
    auStack_1b0 = *(uint (*) [2])((Jx->base).m_backend.data._M_elems + 6);
    local_1a8 = *(uint (*) [2])((Jx->base).m_backend.data._M_elems + 8);
    auStack_1a0 = *(uint (*) [2])((Jx->base).m_backend.data._M_elems + 10);
    local_198 = *(uint (*) [2])((Jx->base).m_backend.data._M_elems + 0xc);
    auStack_190 = *(uint (*) [2])((Jx->base).m_backend.data._M_elems + 0xe);
    local_188 = (Jx->base).m_backend.exp;
    local_184 = (Jx->base).m_backend.neg;
    local_180._0_4_ = (Jx->base).m_backend.fpclass;
    local_180._4_4_ = (Jx->base).m_backend.prec_elem;
    local_2c0._0_4_ = cpp_dec_float_finite;
    local_2c0._4_4_ = 0x10;
    local_308._0_4_ = 0;
    local_308._4_4_ = 0;
    pnStack_300 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                   *)0x0;
    local_2f8[0] = 0;
    local_2f8[1] = 0;
    local_2f8[2] = 0;
    local_2f8[3] = 0;
    local_2f8[4] = 0;
    local_2f8[5] = 0;
    local_2f8[6] = 0;
    local_2f8[7] = 0;
    local_2f8[8] = 0;
    local_2f8[9] = 0;
    stack0xfffffffffffffd30 = 0;
    uStack_2cb = 0;
    iStack_2c8 = 0;
    bStack_2c4 = false;
    local_728 = (undefined1  [8])this;
    pnStack_720 = &Jx->base;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
    ::
    do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::add_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
              ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                *)local_308,
               (expression<boost::multiprecision::detail::add_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                *)local_728,(add_immediates *)&local_7d8);
    local_178.m_backend.data._M_elems[0xf]._1_3_ = uStack_2cb;
    local_178.m_backend.data._M_elems._56_5_ = stack0xfffffffffffffd30;
    pnStack_720 = &local_178;
    local_178.m_backend.data._M_elems[0] = local_308._0_4_;
    local_178.m_backend.data._M_elems[1] = local_308._4_4_;
    local_178.m_backend.data._M_elems._8_8_ = pnStack_300;
    local_178.m_backend.data._M_elems[4] = local_2f8[0];
    local_178.m_backend.data._M_elems[5] = local_2f8[1];
    local_178.m_backend.data._M_elems[6] = local_2f8[2];
    local_178.m_backend.data._M_elems[7] = local_2f8[3];
    local_178.m_backend.data._M_elems[8] = local_2f8[4];
    local_178.m_backend.data._M_elems[9] = local_2f8[5];
    local_178.m_backend.data._M_elems[10] = local_2f8[6];
    local_178.m_backend.data._M_elems[0xb] = local_2f8[7];
    local_178.m_backend.data._M_elems[0xc] = local_2f8[8];
    local_178.m_backend.data._M_elems[0xd] = local_2f8[9];
    local_178.m_backend.exp = iStack_2c8;
    local_178.m_backend.neg = bStack_2c4;
    local_178.m_backend.fpclass = (fpclass_type)local_2c0;
    local_178.m_backend.prec_elem = local_2c0._4_4_;
    local_728._0_4_ = 2;
    local_2c0._0_4_ = cpp_dec_float_finite;
    local_2c0._4_4_ = 0x10;
    local_308 = (undefined1  [8])0x0;
    pnStack_300 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                   *)0x0;
    local_2f8[0] = 0;
    local_2f8[1] = 0;
    local_2f8[2] = 0;
    local_2f8[3] = 0;
    local_2f8[4] = 0;
    local_2f8[5] = 0;
    local_2f8[6] = 0;
    local_2f8[7] = 0;
    local_2f8[8] = 0;
    local_2f8[9] = 0;
    stack0xfffffffffffffd30 = 0;
    uStack_2cb = 0;
    iStack_2c8 = 0;
    bStack_2c4 = false;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
    ::
    do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
              ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                *)local_308,
               (expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                *)local_728,(multiply_immediates *)&local_7d8);
    auStack_f0[1]._1_3_ = uStack_2cb;
    auStack_f0._0_5_ = stack0xfffffffffffffd30;
    local_128._0_8_ = local_308;
    local_128._8_8_ = pnStack_300;
    local_118[0] = local_2f8[0];
    local_118[1] = local_2f8[1];
    auStack_110[0] = local_2f8[2];
    auStack_110[1] = local_2f8[3];
    local_108[0] = local_2f8[4];
    local_108[1] = local_2f8[5];
    auStack_100[0] = local_2f8[6];
    auStack_100[1] = local_2f8[7];
    local_f8[0] = local_2f8[8];
    local_f8[1] = local_2f8[9];
    local_e8 = iStack_2c8;
    local_e4 = bStack_2c4;
    local_e0 = (fpclass_type)local_2c0;
    iStack_dc = local_2c0._4_4_;
    operator/(&local_668,1,
              (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
               *)local_128);
    local_d8.base.m_backend.data._M_elems[0xe] = local_668.base.m_backend.data._M_elems[0xe];
    local_d8.base.m_backend.data._M_elems[0xf] = local_668.base.m_backend.data._M_elems[0xf];
    local_d8.base.m_backend.exp = local_668.base.m_backend.exp;
    local_d8.base.m_backend.neg = local_668.base.m_backend.neg;
    local_d8.base.m_backend.fpclass = local_668.base.m_backend.fpclass;
    local_d8.base.m_backend.prec_elem = local_668.base.m_backend.prec_elem;
    anon_unknown.dwarf_826ab::
    func<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::operator()((autodiff_fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_1UL>
                  *)local_308,
                 (func<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
                  *)local_218,&local_d8);
    local_780 = 0;
    do {
      boost::math::differentiation::autodiff_v1::detail::
      fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_1UL>
      ::derivative<int>((get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_1UL>,_sizeof___(Orders)>
                         *)&local_3a8,
                        (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_1UL>
                         *)local_308,0);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_1UL>
      ::derivative<int>((get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_1UL>,_sizeof___(Orders)>
                         *)local_618,
                        (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_1UL>
                         *)local_308,1);
      local_6e0._0_4_ = cpp_dec_float_finite;
      local_6e0._4_4_ = 0x10;
      local_728 = (undefined1  [8])0x0;
      pnStack_720 = (type)0x0;
      local_718[0] = 0;
      local_718[1] = 0;
      local_718[2] = 0;
      local_718[3] = 0;
      local_718[4] = 0;
      local_718[5] = 0;
      local_718[6] = 0;
      local_718[7] = 0;
      local_718[8] = 0;
      local_718[9] = 0;
      stack0xfffffffffffff910 = 0;
      uStack_6eb = 0;
      iStack_6e8 = 0;
      bStack_6e4 = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)local_728,&local_3a8,
                 (cpp_dec_float<100U,_int,_void> *)local_618);
      local_7a8 = (uint)local_718._32_8_;
      uStack_7a4 = SUB84(local_718._32_8_,4);
      uStack_7a0 = stack0xfffffffffffff910;
      uStack_79b = uStack_6eb;
      local_7b8 = (uint)local_718._16_8_;
      uStack_7b4 = SUB84(local_718._16_8_,4);
      uStack_7b0 = (uint)local_718._24_8_;
      uStack_7ac = SUB84(local_718._24_8_,4);
      local_7c8 = (uint)local_718._0_8_;
      uStack_7c4 = SUB84(local_718._0_8_,4);
      uStack_7c0 = (uint)local_718._8_8_;
      uStack_7bc = SUB84(local_718._8_8_,4);
      local_7d8 = local_728._0_4_;
      uStack_7d4 = local_728._4_4_;
      uStack_7d0 = (uint)pnStack_720;
      uStack_7cc = (uint)((ulong)pnStack_720 >> 0x20);
      iStack_798 = iStack_6e8;
      cStack_794 = bStack_6e4;
      local_790._0_4_ = (fpclass_type)local_6e0;
      local_790._4_4_ = local_6e0._4_4_;
      local_6e0._0_4_ = cpp_dec_float_finite;
      local_6e0._4_4_ = 0x10;
      local_728 = (undefined1  [8])0x0;
      pnStack_720 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                     *)0x0;
      local_718[0] = 0;
      local_718[1] = 0;
      local_718[2] = 0;
      local_718[3] = 0;
      local_718[4] = 0;
      local_718[5] = 0;
      local_718[6] = 0;
      local_718[7] = 0;
      local_718[8] = 0;
      local_718[9] = 0;
      stack0xfffffffffffff910 = 0;
      uStack_6eb = 0;
      iStack_6e8 = 0;
      bStack_6e4 = false;
      local_5c8._0_8_ = &local_668;
      local_5c8._8_8_ =
           (number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
            *)&local_7d8;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
      ::
      do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                  *)local_728,
                 (expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                  *)local_5c8,(subtract_immediates *)&local_358);
      auStack_760[9]._1_3_ = uStack_6eb;
      auStack_760._32_5_ = stack0xfffffffffffff910;
      local_778 = (type)local_728;
      pnStack_770 = pnStack_720;
      local_768[0] = local_718[0];
      local_768[1] = local_718[1];
      auStack_760[0] = local_718[2];
      auStack_760[1] = local_718[3];
      auStack_760[2] = local_718[4];
      auStack_760[3] = local_718[5];
      auStack_760[4] = local_718[6];
      auStack_760[5] = local_718[7];
      auStack_760[6] = local_718[8];
      auStack_760[7] = local_718[9];
      local_738 = iStack_6e8;
      local_734[0] = bStack_6e4;
      local_730 = (fpclass_type)local_6e0;
      iStack_72c = local_6e0._4_4_;
      local_498 = (type)local_728;
      pnStack_490 = pnStack_720;
      local_488[0] = local_718[0];
      local_488[1] = local_718[1];
      auStack_480[0] = local_718[2];
      auStack_480[1] = local_718[3];
      local_478[0] = local_718[4];
      local_478[1] = local_718[5];
      auStack_470[0] = local_718[6];
      auStack_470[1] = local_718[7];
      local_468[0] = local_718[8];
      local_468[1] = local_718[9];
      local_458 = iStack_6e8;
      local_454 = bStack_6e4;
      local_450 = (fpclass_type)local_6e0;
      local_44c = local_6e0._4_4_;
      auStack_460 = (uint  [2])auStack_760._32_8_;
      anon_unknown.dwarf_826ab::
      func<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
      ::operator()((autodiff_fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_1UL>
                    *)local_728,
                   (func<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
                    *)local_218,
                   (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)&local_498);
      local_618._0_8_ = &local_778;
      local_790._0_4_ = cpp_dec_float_finite;
      local_790._4_4_ = 0x10;
      local_7d8 = 0;
      uStack_7d4 = 0;
      uStack_7d0 = 0;
      uStack_7cc = 0;
      local_7c8 = 0;
      uStack_7c4 = 0;
      uStack_7c0 = 0;
      uStack_7bc = 0;
      local_7b8 = 0;
      uStack_7b4 = 0;
      uStack_7b0 = 0;
      uStack_7ac = 0;
      local_7a8 = 0;
      uStack_7a4 = 0;
      uStack_7a0 = 0;
      uStack_79b = 0;
      iStack_798 = 0;
      cStack_794 = '\0';
      local_618._8_8_ = &local_668;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
      ::
      do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                  *)&local_7d8,
                 (expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                  *)local_618,(subtract_immediates *)local_5c8);
      local_578[1] = uStack_7d0;
      local_578[0] = uStack_7d4;
      auStack_570[1] = local_7c8;
      auStack_570[0] = uStack_7cc;
      local_568[1] = uStack_7c0;
      local_568[0] = uStack_7c4;
      auStack_560[1] = local_7b8;
      auStack_560[0] = uStack_7bc;
      local_558[1] = uStack_7b0;
      local_558[0] = uStack_7b4;
      auStack_544[1]._1_3_ = uStack_79b;
      auStack_544._0_5_ = uStack_7a0;
      uStack_550 = uStack_7ac;
      uStack_54c = local_7a8;
      uStack_548 = uStack_7a4;
      local_3a8.neg = (bool)cStack_794;
      if (cStack_794 == '\x01') {
        local_3a8.neg = (fpclass_type)local_790 == cpp_dec_float_finite && local_7d8 == 0;
      }
      local_3a8.data._M_elems[0] = local_7d8;
      local_3a8.data._M_elems[0xd] = uStack_7a4;
      local_3a8.data._M_elems[0xb] = uStack_7ac;
      local_3a8.data._M_elems[0xc] = local_7a8;
      local_3a8.exp = iStack_798;
      local_3a8.fpclass = (fpclass_type)local_790;
      local_3a8.prec_elem = local_790._4_4_;
      local_358.m_backend.neg = local_668.base.m_backend.neg;
      if (local_668.base.m_backend.neg == true) {
        local_358.m_backend.neg =
             local_668.base.m_backend.fpclass == cpp_dec_float_finite &&
             local_668.base.m_backend.data._M_elems[0] == 0;
      }
      local_358.m_backend.data._M_elems[0] = local_668.base.m_backend.data._M_elems[0];
      local_358.m_backend.data._M_elems[2] = local_668.base.m_backend.data._M_elems[2];
      local_358.m_backend.data._M_elems[1] = local_668.base.m_backend.data._M_elems[1];
      local_358.m_backend.data._M_elems[4] = local_668.base.m_backend.data._M_elems[4];
      local_358.m_backend.data._M_elems[3] = local_668.base.m_backend.data._M_elems[3];
      local_358.m_backend.data._M_elems[6] = local_668.base.m_backend.data._M_elems[6];
      local_358.m_backend.data._M_elems[5] = local_668.base.m_backend.data._M_elems[5];
      local_358.m_backend.data._M_elems[8] = local_668.base.m_backend.data._M_elems[8];
      local_358.m_backend.data._M_elems[7] = local_668.base.m_backend.data._M_elems[7];
      local_358.m_backend.data._M_elems[10] = local_668.base.m_backend.data._M_elems[10];
      local_358.m_backend.data._M_elems[9] = local_668.base.m_backend.data._M_elems[9];
      local_358.m_backend.data._M_elems[0xd] = local_668.base.m_backend.data._M_elems[0xd];
      local_358.m_backend.data._M_elems[0xe] = local_668.base.m_backend.data._M_elems[0xe];
      local_358.m_backend.data._M_elems[0xf] = local_668.base.m_backend.data._M_elems[0xf];
      local_358.m_backend.data._M_elems[0xb] = local_668.base.m_backend.data._M_elems[0xb];
      local_358.m_backend.data._M_elems[0xc] = local_668.base.m_backend.data._M_elems[0xc];
      local_358.m_backend.exp = local_668.base.m_backend.exp;
      local_358.m_backend.fpclass = local_668.base.m_backend.fpclass;
      local_358.m_backend.prec_elem = local_668.base.m_backend.prec_elem;
      local_538.arg1 = 2;
      local_538.arg2 = &local_358;
      local_790._0_4_ = cpp_dec_float_finite;
      local_790._4_4_ = 0x10;
      local_7d8 = 0;
      uStack_7d4 = 0;
      uStack_7d0 = 0;
      uStack_7cc = 0;
      local_7c8 = 0;
      uStack_7c4 = 0;
      uStack_7c0 = 0;
      uStack_7bc = 0;
      local_7b8 = 0;
      uStack_7b4 = 0;
      uStack_7b0 = 0;
      uStack_7ac = 0;
      local_7a8 = 0;
      uStack_7a4 = 0;
      uStack_7a0 = 0;
      uStack_79b = 0;
      iStack_798 = 0;
      cStack_794 = 0;
      local_3a8.data._M_elems._4_8_ = local_578;
      local_3a8.data._M_elems._12_8_ = auStack_570;
      local_3a8.data._M_elems._20_8_ = local_568;
      local_3a8.data._M_elems._28_8_ = auStack_560;
      local_3a8.data._M_elems._36_8_ = local_558;
      local_3a8.data._M_elems._56_8_ = auStack_544._0_8_;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
      ::
      do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                  *)&local_7d8,&local_538,(multiply_immediates *)local_4e8);
      local_5c8._0_8_ = CONCAT44(uStack_7d4,local_7d8);
      local_5c8._8_8_ = CONCAT44(uStack_7cc,uStack_7d0);
      local_5b8[1] = uStack_7c4;
      local_5b8[0] = local_7c8;
      auStack_5b0[1] = uStack_7bc;
      auStack_5b0[0] = uStack_7c0;
      local_5a8[1] = uStack_7b4;
      local_5a8[0] = local_7b8;
      auStack_5a0[1] = uStack_7ac;
      auStack_5a0[0] = uStack_7b0;
      local_598[1] = uStack_7a4;
      local_598[0] = local_7a8;
      auStack_590[1]._1_3_ = uStack_79b;
      auStack_590._0_5_ = uStack_7a0;
      local_588 = iStack_798;
      local_584 = (bool)cStack_794;
      local_580 = (fpclass_type)local_790;
      iStack_57c = local_790._4_4_;
      pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::eps();
      local_538.arg1 = (pcVar18->data)._M_elems[0];
      local_538._4_4_ = (pcVar18->data)._M_elems[1];
      local_538.arg2 = *(type *)((pcVar18->data)._M_elems + 2);
      local_528 = *(undefined8 *)((pcVar18->data)._M_elems + 4);
      uStack_520 = *(undefined8 *)((pcVar18->data)._M_elems + 6);
      local_518 = *(undefined8 *)((pcVar18->data)._M_elems + 8);
      uStack_510 = *(undefined8 *)((pcVar18->data)._M_elems + 10);
      local_508 = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
      uStack_500 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
      local_4f8 = pcVar18->exp;
      local_4f4 = pcVar18->neg;
      local_4f0._0_4_ = pcVar18->fpclass;
      local_4f0._4_4_ = pcVar18->prec_elem;
      local_4e8._0_8_ = local_5c8;
      local_790._0_4_ = cpp_dec_float_finite;
      local_790._4_4_ = 0x10;
      local_7d8 = 0;
      uStack_7d4 = 0;
      uStack_7d0 = 0;
      uStack_7cc = 0;
      local_7c8 = 0;
      uStack_7c4 = 0;
      uStack_7c0 = 0;
      uStack_7bc = 0;
      local_7b8 = 0;
      uStack_7b4 = 0;
      uStack_7b0 = 0;
      uStack_7ac = 0;
      local_7a8 = 0;
      uStack_7a4 = 0;
      uStack_7a0 = 0;
      uStack_79b = 0;
      iStack_798 = 0;
      cStack_794 = 0;
      unique0x100030e1 = &local_538;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
      ::
      do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                  *)&local_7d8,
                 (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                  *)local_4e8,(multiply_immediates *)local_268);
      local_618._0_8_ = CONCAT44(uStack_7d4,local_7d8);
      local_618._8_8_ = CONCAT44(uStack_7cc,uStack_7d0);
      local_608[1] = uStack_7c4;
      local_608[0] = local_7c8;
      auStack_600[1] = uStack_7bc;
      auStack_600[0] = uStack_7c0;
      local_5f8[1] = uStack_7b4;
      local_5f8[0] = local_7b8;
      auStack_5f0[1] = uStack_7ac;
      auStack_5f0[0] = uStack_7b0;
      local_5e8[1] = uStack_7a4;
      local_5e8[0] = local_7a8;
      auStack_5e0[1]._1_3_ = uStack_79b;
      auStack_5e0._0_5_ = uStack_7a0;
      local_5d8 = iStack_798;
      local_5d4 = (bool)cStack_794;
      local_5d0 = (fpclass_type)local_790;
      iStack_5cc = local_790._4_4_;
      if ((fpclass_type)local_790 != cpp_dec_float_NaN && local_3a8.fpclass != cpp_dec_float_NaN) {
        iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_3a8,(cpp_dec_float<100U,_int,_void> *)local_618);
        lVar21 = local_780;
        if (iVar17 < 0) goto LAB_0012c106;
      }
      lVar21 = local_780;
      boost::math::differentiation::autodiff_v1::detail::
      fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_1UL>
      ::derivative<int>((get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_1UL>,_sizeof___(Orders)>
                         *)local_268,
                        (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_1UL>
                         *)local_728,0);
      local_4a4 = (bool)local_224;
      if (local_224 == '\x01') {
        local_4a4 = (fpclass_type)_local_220 == cpp_dec_float_finite && local_268[0] == 0;
      }
      local_4e8._0_4_ = local_268[0];
      auStack_4b0[0] = auStack_230[0];
      auStack_4b0[1] = auStack_230[1];
      auStack_4c4[0] = local_244[0];
      auStack_4c4[1] = local_244[1];
      local_4d4[0] = local_254[0];
      local_4d4[1] = local_254[1];
      auStack_4cc[0] = auStack_24c[0];
      auStack_4cc[1] = auStack_24c[1];
      local_4e8._4_4_ = (undefined4)local_268._4_8_;
      local_4e8._8_4_ = SUB84(local_268._4_8_,4);
      uStack_4dc = (uint)local_268._12_8_;
      uStack_4d8 = SUB84(local_268._12_8_,4);
      local_4a8 = local_228;
      local_4a0 = local_220;
      iStack_49c = iStack_21c;
      pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::eps();
      local_448.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pcVar18->data)._M_elems;
      local_448.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 2);
      local_448.m_backend.data._M_elems._16_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 4);
      local_448.m_backend.data._M_elems._24_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 6);
      local_448.m_backend.data._M_elems._32_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 8);
      local_448.m_backend.data._M_elems._40_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 10);
      local_448.m_backend.data._M_elems._48_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
      local_448.m_backend.data._M_elems._56_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
      local_448.m_backend.exp = pcVar18->exp;
      local_448.m_backend.neg = pcVar18->neg;
      local_448.m_backend.fpclass = pcVar18->fpclass;
      local_448.m_backend.prec_elem = pcVar18->prec_elem;
      local_678.arg1 = 2;
      local_678.arg2 = &local_448;
      local_790._0_4_ = cpp_dec_float_finite;
      local_790._4_4_ = 0x10;
      local_7d8 = 0;
      uStack_7d4 = 0;
      uStack_7d0 = 0;
      uStack_7cc = 0;
      local_7c8 = 0;
      uStack_7c4 = 0;
      uStack_7c0 = 0;
      uStack_7bc = 0;
      local_7b8 = 0;
      uStack_7b4 = 0;
      uStack_7b0 = 0;
      uStack_7ac = 0;
      local_7a8 = 0;
      uStack_7a4 = 0;
      uStack_7a0 = 0;
      uStack_79b = 0;
      iStack_798 = 0;
      cStack_794 = 0;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
      ::
      do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                  *)&local_7d8,&local_678,&local_7d9);
      uVar12._5_3_ = uStack_79b;
      uVar12._0_5_ = uStack_7a0;
      local_3f8.data._M_elems[0] = local_7d8;
      local_3f8.data._M_elems[1] = uStack_7d4;
      local_3f8.data._M_elems[2] = uStack_7d0;
      local_3f8.data._M_elems[3] = uStack_7cc;
      local_3f8.data._M_elems[4] = local_7c8;
      local_3f8.data._M_elems[5] = uStack_7c4;
      local_3f8.data._M_elems[6] = uStack_7c0;
      local_3f8.data._M_elems[7] = uStack_7bc;
      local_3f8.data._M_elems[8] = local_7b8;
      local_3f8.data._M_elems[9] = uStack_7b4;
      local_3f8.data._M_elems[10] = uStack_7b0;
      local_3f8.data._M_elems[0xb] = uStack_7ac;
      local_3f8.data._M_elems[0xc] = local_7a8;
      local_3f8.data._M_elems[0xd] = uStack_7a4;
      local_3f8.data._M_elems[0xe] = (uint)uStack_7a0;
      local_3f8.data._M_elems[0xf] = SUB84(uVar12,4);
      local_3f8.exp = iStack_798;
      local_3f8.neg = (bool)cStack_794;
      local_3f8.fpclass = (fpclass_type)local_790;
      local_3f8.prec_elem = local_790._4_4_;
      if ((fpclass_type)local_790 != cpp_dec_float_NaN && local_4a0 != cpp_dec_float_NaN) {
        iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           ((cpp_dec_float<100U,_int,_void> *)local_4e8,&local_3f8);
        if (iVar17 < 0) {
LAB_0012c106:
          pmVar14 = local_680;
          local_38 = lVar21 + 1;
          local_58[0] = auStack_760[6];
          local_58[1] = auStack_760[7];
          auStack_50[0] = auStack_760[8];
          auStack_50[1] = auStack_760[9];
          local_68[0] = auStack_760[2];
          local_68[1] = auStack_760[3];
          auStack_60[0] = auStack_760[4];
          auStack_60[1] = auStack_760[5];
          local_78[0] = local_768[0];
          local_78[1] = local_768[1];
          auStack_70[0] = auStack_760[0];
          auStack_70[1] = auStack_760[1];
          local_88 = local_778;
          pnStack_80 = pnStack_770;
          local_48 = local_738;
          local_44 = (bool)local_734[0];
          local_40._4_4_ = iStack_72c;
          local_40._0_4_ = local_730;
          operator/(local_680,1,
                    (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                     *)&local_88);
          return pmVar14;
        }
      }
      local_668.base.m_backend.data._M_elems[0xc] = (uint)auStack_760._24_8_;
      local_668.base.m_backend.data._M_elems[0xd] = SUB84(auStack_760._24_8_,4);
      local_668.base.m_backend.data._M_elems[0xe] = auStack_760[8];
      local_668.base.m_backend.data._M_elems[0xf] = auStack_760[9];
      local_668.base.m_backend.data._M_elems[8] = (uint)auStack_760._8_8_;
      local_668.base.m_backend.data._M_elems[9] = SUB84(auStack_760._8_8_,4);
      local_668.base.m_backend.data._M_elems[10] = (uint)auStack_760._16_8_;
      local_668.base.m_backend.data._M_elems[0xb] = SUB84(auStack_760._16_8_,4);
      local_668.base.m_backend.data._M_elems[4] = local_768[0];
      local_668.base.m_backend.data._M_elems[5] = local_768[1];
      local_668.base.m_backend.data._M_elems[6] = (uint)auStack_760._0_8_;
      local_668.base.m_backend.data._M_elems[7] = SUB84(auStack_760._0_8_,4);
      local_668.base.m_backend.data._M_elems[0] = (uint)local_778;
      local_668.base.m_backend.data._M_elems[1] = (uint)((ulong)local_778 >> 0x20);
      local_668.base.m_backend.data._M_elems[2] = (uint)pnStack_770;
      local_668.base.m_backend.data._M_elems[3] = (uint)((ulong)pnStack_770 >> 0x20);
      local_668.base.m_backend.exp = local_738;
      local_668.base.m_backend.neg = (bool)local_734[0];
      local_668.base.m_backend.fpclass = local_730;
      local_668.base.m_backend.prec_elem = iStack_72c;
      lVar19 = 0x48;
      do {
        uVar12 = *(undefined8 *)((long)&pnStack_770 + lVar19);
        uVar13 = *(undefined8 *)((long)local_768 + lVar19);
        uVar1 = *(undefined4 *)((long)auStack_760 + lVar19);
        uVar2 = *(undefined4 *)((long)auStack_760 + lVar19 + 4);
        uVar3 = *(undefined4 *)((long)auStack_760 + lVar19 + 8);
        uVar4 = *(undefined4 *)((long)auStack_760 + lVar19 + 0xc);
        uVar5 = *(undefined4 *)((long)auStack_760 + lVar19 + 0x10);
        uVar6 = *(undefined4 *)((long)auStack_760 + lVar19 + 0x14);
        uVar7 = *(undefined4 *)((long)auStack_760 + lVar19 + 0x18);
        uVar8 = *(undefined4 *)((long)auStack_760 + lVar19 + 0x1c);
        uVar9 = *(undefined4 *)((long)auStack_760 + lVar19 + 0x24);
        uVar10 = *(undefined4 *)(local_734 + lVar19 + -4);
        uVar11 = *(undefined4 *)(local_734 + lVar19);
        *(undefined4 *)((long)local_358.m_backend.data._M_elems + lVar19 + 0x38) =
             *(undefined4 *)((long)auStack_760 + lVar19 + 0x20);
        *(undefined4 *)((long)local_358.m_backend.data._M_elems + lVar19 + 0x3c) = uVar9;
        *(undefined4 *)((long)(&local_358.m_backend.data + 1) + lVar19) = uVar10;
        *(undefined4 *)((long)(&local_358.m_backend.data + 1) + lVar19 + 4U) = uVar11;
        *(undefined4 *)((long)local_358.m_backend.data._M_elems + lVar19 + 0x28) = uVar5;
        *(undefined4 *)((long)local_358.m_backend.data._M_elems + lVar19 + 0x2c) = uVar6;
        *(undefined4 *)((long)local_358.m_backend.data._M_elems + lVar19 + 0x30) = uVar7;
        *(undefined4 *)((long)local_358.m_backend.data._M_elems + lVar19 + 0x34) = uVar8;
        *(undefined4 *)((long)local_358.m_backend.data._M_elems + lVar19 + 0x18) = uVar1;
        *(undefined4 *)((long)local_358.m_backend.data._M_elems + lVar19 + 0x1c) = uVar2;
        *(undefined4 *)((long)local_358.m_backend.data._M_elems + lVar19 + 0x20) = uVar3;
        *(undefined4 *)((long)local_358.m_backend.data._M_elems + lVar19 + 0x24) = uVar4;
        *(undefined8 *)((long)local_358.m_backend.data._M_elems + lVar19 + 8) = uVar12;
        *(undefined8 *)((long)local_358.m_backend.data._M_elems + lVar19 + 0x10) = uVar13;
        *(undefined4 *)((long)(&local_358.m_backend.data + 1) + lVar19 + 8U) =
             *(undefined4 *)((long)&local_730 + lVar19);
        *(undefined1 *)((long)(&local_358.m_backend.data + 1) + lVar19 + 0xcU) =
             *(undefined1 *)((long)&iStack_72c + lVar19);
        *(undefined8 *)(local_308 + lVar19) = *(undefined8 *)(local_728 + lVar19);
        lVar19 = lVar19 + 0x50;
      } while (lVar19 != 0xe8);
      local_780 = lVar21 + 1;
    } while (local_780 != 0x100);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"convergence error");
    puVar22 = &std::runtime_error::typeinfo;
    pcVar20 = std::runtime_error::~runtime_error;
  }
  __cxa_throw(this_00,puVar22,pcVar20);
}

Assistant:

inline T square(T Jx, T Jy) {
  Jx = abs(Jx);
  Jy = abs(Jy);
  if (Jx * Jy <= 0) throw(std::invalid_argument("Jx * Jy should be non-zero"));
  auto result = standards::newton_1d(func<T>(Jx, Jy), 1 / (2 * (Jx + Jy)));
  if (!result.second) throw(std::runtime_error("convergence error"));
  return 1 / result.first;
}